

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O1

void TadsHttpRequestHeader::fix_multiline_headers(StringRef *hdrs,int start_ofs)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  
  pcVar2 = hdrs->str;
  lVar8 = hdrs->len;
  pcVar6 = pcVar2 + start_ofs;
  pcVar7 = pcVar6;
  if (start_ofs < lVar8) {
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\n') {
LAB_00209fb1:
        *pcVar7 = ' ';
        pcVar6 = pcVar6 + 1;
LAB_00209fc6:
        pcVar7 = pcVar7 + 1;
      }
      else {
        if (cVar1 != '\r') {
          pcVar6 = pcVar6 + 1;
          *pcVar7 = cVar1;
          goto LAB_00209fc6;
        }
        if (pcVar6[1] != '\n') goto LAB_00209fb1;
        cVar1 = pcVar6[2];
        uVar5 = 0;
        if ((cVar1 != '\0') && (cVar1 != '\r')) {
          uVar5 = (uint)(cVar1 != '\n');
        }
        iVar4 = isspace(uVar5);
        if (iVar4 != 0) {
          *pcVar7 = ' ';
          pcVar3 = pcVar6 + 2;
          do {
            pcVar6 = pcVar3;
            cVar1 = *pcVar6;
            iVar4 = isspace((int)cVar1);
            if ((iVar4 == 0) || (cVar1 == '\n')) break;
            pcVar3 = pcVar6 + 1;
          } while (cVar1 != '\r');
          goto LAB_00209fc6;
        }
        *pcVar7 = '\r';
        pcVar7[1] = pcVar6[1];
        pcVar7 = pcVar7 + 2;
        pcVar6 = pcVar6 + 2;
      }
    } while (pcVar6 < pcVar2 + lVar8);
  }
  lVar8 = (long)pcVar7 - (long)hdrs->str;
  if (lVar8 < hdrs->len) {
    hdrs->len = lVar8;
    hdrs->str[lVar8] = '\0';
  }
  return;
}

Assistant:

static void fix_multiline_headers(StringRef *hdrs, int start_ofs)
    {
        /*
         *   Look for CR LF <space>+ <^space> sequences, and delete the line
         *   breaks in each one.  
         */
        char *p, *dst, *endp = hdrs->getend();
        for (dst = p = hdrs->get() + start_ofs ; p < endp ; )
        {
            /* check for a line break */
            if (*p == '\r' && *(p+1) == '\n')
            {
                /* 
                 *   if the next line starts with whitespace, it's a
                 *   continuation line; otherwise it's a new header 
                 */
                if (isspace(*(p+2) && *(p+2) != '\r' && *(p+2) != '\n'))
                {
                    /* 
                     *   it's a continuation line - replace the CR-LF with a
                     *   single space, then skip all of the whitespace at the
                     *   start of this line 
                     */
                    *dst++ = ' ';
                    for (p += 2 ; isspace(*p) && *p != '\r' && *p != '\n' ;
                         ++p) ;
                }
                else
                {
                    /* it's not a continuation line, so copy it as-is */
                    *dst++ = *p++;
                    *dst++ = *p++;
                }
            }
            else if (*p == '\r' || *p == '\n')
            {
                /* unpaired CR or LF - convert it to a space */
                *dst++ = ' ';
                ++p;
            }
            else
            {
                /* ordinary character - copy it unchanged */
                *dst++ = *p++;
            }
        }
        
        /* set the new size of the headers */
        hdrs->truncate(dst - hdrs->get());
    }